

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tiles.cpp
# Opt level: O3

bool __thiscall sfc::Tile::operator==(Tile *this,Tile *other)

{
  pointer __s1;
  pointer puVar1;
  pointer puVar2;
  pointer pvVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  pointer pvVar7;
  pointer pvVar8;
  size_t __n;
  
  __s1 = (other->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  puVar1 = (other->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __n = (long)puVar1 - (long)__s1;
  puVar2 = (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (__n == (long)(this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) {
    if (puVar1 == __s1) {
      return true;
    }
    iVar4 = bcmp(__s1,puVar2,__n);
    if (iVar4 == 0) {
      return true;
    }
  }
  pvVar7 = (this->_mirrors).
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (this->_mirrors).
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar7 == pvVar3) {
    return false;
  }
  lVar5 = (long)pvVar3 - (long)pvVar7;
  lVar6 = (lVar5 >> 3) * -0x5555555555555555 >> 2;
  if (0 < lVar6) {
    lVar5 = lVar6 + 1;
    pvVar8 = pvVar7 + 2;
    do {
      puVar1 = pvVar8[-2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = pvVar8[-2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (((long)puVar2 - (long)puVar1 == __n) &&
         ((puVar2 == puVar1 || (iVar4 = bcmp(puVar1,__s1,__n), iVar4 == 0)))) {
        pvVar8 = pvVar8 + -2;
        goto LAB_001542d5;
      }
      puVar1 = pvVar8[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = pvVar8[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (((long)puVar2 - (long)puVar1 == __n) &&
         ((puVar2 == puVar1 || (iVar4 = bcmp(puVar1,__s1,__n), iVar4 == 0)))) {
        pvVar8 = pvVar8 + -1;
        goto LAB_001542d5;
      }
      puVar1 = (pvVar8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (pvVar8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (((long)puVar2 - (long)puVar1 == __n) &&
         ((puVar2 == puVar1 || (iVar4 = bcmp(puVar1,__s1,__n), iVar4 == 0)))) goto LAB_001542d5;
      puVar1 = pvVar8[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = pvVar8[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (((long)puVar2 - (long)puVar1 == __n) &&
         ((puVar2 == puVar1 || (iVar4 = bcmp(puVar1,__s1,__n), iVar4 == 0)))) {
        pvVar8 = pvVar8 + 1;
        goto LAB_001542d5;
      }
      lVar5 = lVar5 + -1;
      pvVar8 = pvVar8 + 4;
    } while (1 < lVar5);
    lVar5 = (long)pvVar3 - (long)(pvVar7 + lVar6 * 4);
    pvVar7 = pvVar7 + lVar6 * 4;
  }
  lVar5 = (lVar5 >> 3) * -0x5555555555555555;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pvVar8 = pvVar3;
      if (lVar5 != 3) goto LAB_001542d5;
      puVar1 = (pvVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (pvVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (((long)puVar2 - (long)puVar1 == __n) &&
         ((pvVar8 = pvVar7, puVar2 == puVar1 || (iVar4 = bcmp(puVar1,__s1,__n), iVar4 == 0))))
      goto LAB_001542d5;
      pvVar7 = pvVar7 + 1;
    }
    puVar1 = (pvVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (pvVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (((long)puVar2 - (long)puVar1 == __n) &&
       ((pvVar8 = pvVar7, puVar2 == puVar1 || (iVar4 = bcmp(puVar1,__s1,__n), iVar4 == 0))))
    goto LAB_001542d5;
    pvVar7 = pvVar7 + 1;
  }
  puVar1 = (pvVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (pvVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pvVar8 = pvVar3;
  if ((((long)puVar2 - (long)puVar1 == __n) && (pvVar8 = pvVar7, puVar2 != puVar1)) &&
     (iVar4 = bcmp(puVar1,__s1,__n), iVar4 != 0)) {
    pvVar8 = pvVar3;
  }
LAB_001542d5:
  return pvVar8 != pvVar3;
}

Assistant:

bool Tile::operator==(const Tile& other) const {
  if (other._data == _data)
    return true;
  if (!_mirrors.empty()) {
    return std::any_of(_mirrors.begin(), _mirrors.end(), [&](const auto& m) { return m == other._data; });
  }
  return false;
}